

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O0

void __thiscall
stk::FileRead::FileRead
          (FileRead *this,string *fileName,bool typeRaw,uint nChannels,StkFormat format,
          StkFloat rate)

{
  string local_50 [32];
  StkFloat local_30;
  StkFloat rate_local;
  StkFormat format_local;
  uint nChannels_local;
  bool typeRaw_local;
  string *fileName_local;
  FileRead *this_local;
  
  local_30 = rate;
  rate_local = (StkFloat)format;
  format_local._0_4_ = nChannels;
  format_local._7_1_ = typeRaw;
  _nChannels_local = fileName;
  fileName_local = (string *)this;
  Stk::Stk(&this->super_Stk);
  (this->super_Stk)._vptr_Stk = (_func_int **)&PTR__FileRead_00123ce0;
  this->fd_ = (FILE *)0x0;
  std::__cxx11::string::string(local_50,(string *)fileName);
  open(this,(char *)local_50,format_local._7_1_ & 1,local_30,(ulong)(uint)format_local,rate_local);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

FileRead :: FileRead( std::string fileName, bool typeRaw, unsigned int nChannels,
                      StkFormat format, StkFloat rate )
  : fd_(0)
{
  open( fileName, typeRaw, nChannels, format, rate );
}